

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::rust::AccessorGenerator::GenerateMsgImpl
          (AccessorGenerator *this,Context *ctx,FieldDescriptor *field,AccessorCase accessor_case)

{
  undefined4 in_register_0000000c;
  FieldDescriptor *field_00;
  anon_class_1_0_00000001 local_129;
  string local_128;
  string local_108;
  Sub local_e8;
  
  field_00 = (FieldDescriptor *)CONCAT44(in_register_0000000c,accessor_case);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"comment","");
  FieldInfoComment_abi_cxx11_(&local_108,(rust *)ctx,(Context *)field,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,&local_128,&local_108);
  google::protobuf::io::Printer::Emit(ctx->printer_,&local_e8,1,0x18,"\n      // $comment$\n    ");
  if (local_e8.annotation_.
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &local_e8.annotation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.value_.consume_after._M_dataplus._M_p != &local_e8.value_.consume_after.field_2) {
    operator_delete(local_e8.value_.consume_after._M_dataplus._M_p,
                    local_e8.value_.consume_after.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_e8.value_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)(&local_129,&local_e8.value_.value);
  local_e8.value_.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.key_._M_dataplus._M_p != &local_e8.key_.field_2) {
    operator_delete(local_e8.key_._M_dataplus._M_p,local_e8.key_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  (*this->_vptr_AccessorGenerator[2])(this,ctx,field,(ulong)accessor_case);
  google::protobuf::io::Printer::WriteRaw((char *)ctx->printer_,0x465d8f);
  return;
}

Assistant:

void GenerateMsgImpl(Context& ctx, const FieldDescriptor& field,
                       AccessorCase accessor_case) const {
    ctx.Emit({{"comment", FieldInfoComment(ctx, field)}}, R"rs(
      // $comment$
    )rs");
    InMsgImpl(ctx, field, accessor_case);
    ctx.printer().PrintRaw("\n");
  }